

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O0

QStringList * __thiscall QConcatenateTablesProxyModel::mimeTypes(QConcatenateTablesProxyModel *this)

{
  bool bVar1;
  const_reference pMVar2;
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *in_RDI;
  QConcatenateTablesProxyModelPrivate *d;
  QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *this_00;
  
  this_00 = in_RDI;
  d_func((QConcatenateTablesProxyModel *)0x857c48);
  bVar1 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::isEmpty
                    ((QList<QConcatenateTablesProxyModelPrivate::ModelInfo> *)0x857c5e);
  if (bVar1) {
    memset(in_RDI,0,0x18);
    QList<QString>::QList((QList<QString> *)0x857c7d);
  }
  else {
    pMVar2 = QList<QConcatenateTablesProxyModelPrivate::ModelInfo>::at(this_00,(qsizetype)in_RDI);
    (*(pMVar2->model->super_QObject)._vptr_QObject[0x19])(in_RDI);
  }
  return (QStringList *)this_00;
}

Assistant:

QStringList QConcatenateTablesProxyModel::mimeTypes() const
{
    Q_D(const QConcatenateTablesProxyModel);
    if (d->m_models.isEmpty())
        return QStringList();
    return d->m_models.at(0).model->mimeTypes();
}